

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

char * __thiscall ON_String::SetLength(ON_String *this,size_t string_length)

{
  int iVar1;
  ON_aStringHeader *pOVar2;
  int length;
  size_t string_length_local;
  ON_String *this_local;
  
  iVar1 = (int)string_length;
  pOVar2 = Header(this);
  if (pOVar2->string_capacity <= iVar1) {
    ReserveArray(this,(long)iVar1);
  }
  if ((-1 < iVar1) && (pOVar2 = Header(this), iVar1 <= pOVar2->string_capacity)) {
    CopyArray(this);
    pOVar2 = Header(this);
    pOVar2->string_length = iVar1;
    this->m_s[iVar1] = '\0';
    return this->m_s;
  }
  return (char *)0x0;
}

Assistant:

char* ON_String::SetLength(size_t string_length)
{
  int length = (int)string_length; // for 64 bit compilers
  if ( length >= Header()->string_capacity ) {
    ReserveArray(length);
  }
  if ( length >= 0 && length <= Header()->string_capacity ) {
    CopyArray();
    Header()->string_length = length;
    m_s[length] = 0;
    return m_s;
  }
  return nullptr;
}